

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSObjectFieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  bool bVar1;
  bool in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_21;
  GeneratorOptions *local_20;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  string *name;
  
  local_21 = 0;
  local_20 = options;
  field_local = (FieldDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,options,(FieldDescriptor *)0x0,false,false,
                     in_stack_ffffffffffffff88);
  bVar1 = anon_unknown_0::IsReserved(__return_storage_ptr__);
  if (bVar1) {
    std::operator+(&local_58,"pb_",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSObjectFieldName(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ false,
                             /* is_map = */ false,
                             /* drop_list = */ false);
  if (IsReserved(name)) {
    name = "pb_" + name;
  }
  return name;
}